

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_>::alloc
          (array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> *this,int new_len
          )

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  CRule *p;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  CRule *pCVar8;
  long lVar9;
  
  this->list_size = new_len;
  pCVar8 = allocator_default<CDoodadsMapper::CRule>::alloc_array(new_len);
  uVar3 = this->list_size;
  if (this->num_elements < this->list_size) {
    uVar3 = this->num_elements;
  }
  lVar9 = 0;
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  for (; p = this->list, (ulong)uVar3 * 0x28 - lVar9 != 0; lVar9 = lVar9 + 0x28) {
    *(undefined8 *)((long)&pCVar8->m_HFlip + lVar9) = *(undefined8 *)((long)&p->m_HFlip + lVar9);
    puVar1 = (undefined8 *)((long)&(p->m_Rect).field_0 + lVar9);
    uVar4 = *puVar1;
    uVar5 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(p->m_RelativePos).field_0 + lVar9);
    uVar6 = puVar1[1];
    puVar2 = (undefined8 *)((long)&(pCVar8->m_RelativePos).field_0 + lVar9);
    *puVar2 = *puVar1;
    puVar2[1] = uVar6;
    puVar1 = (undefined8 *)((long)&(pCVar8->m_Rect).field_0 + lVar9);
    *puVar1 = uVar4;
    puVar1[1] = uVar5;
  }
  allocator_default<CDoodadsMapper::CRule>::free_array(p);
  iVar7 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar7 = this->num_elements;
  }
  this->num_elements = iVar7;
  this->list = pCVar8;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}